

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O0

Term * Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                 (Term *trm,Substitution *applicator,bool noSharing)

{
  byte bVar1;
  bool bVar2;
  SpecialFunctor SVar3;
  uint uVar4;
  Stack<Kernel::TermList_*> *this;
  Stack<Kernel::Term_*> *pSVar5;
  Stack<Kernel::TermList> *pSVar6;
  Stack<Kernel::TermList> *pSVar7;
  size_t sVar8;
  TermList *pTVar9;
  Stack<bool> *pSVar10;
  Term *pTVar11;
  byte in_DL;
  __off_t __length;
  __off_t __length_00;
  Term *in_RSI;
  Term *in_RDI;
  bool shouldShare_1;
  Literal *lit;
  TermList *argLst_1;
  Term *result;
  Term *t;
  TermList tDest_1;
  TermList tDest;
  TermList tl;
  Term *newTrm;
  bool shouldShare;
  TermList *argLst;
  Term *orig;
  TermList *tt;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> args;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> modified;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> terms;
  Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> toDo;
  uint i;
  DArray<Kernel::TermList> terms_1;
  SpecialTermData *sd;
  Term *in_stack_fffffffffffffb78;
  TermList in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  uint in_stack_fffffffffffffb98;
  uint in_stack_fffffffffffffb9c;
  Term *in_stack_fffffffffffffba0;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffbc0;
  Stack<bool> *in_stack_fffffffffffffbf0;
  Stack<Kernel::Term_*> *in_stack_fffffffffffffbf8;
  bool local_2dd;
  Term *local_1b8;
  TermList local_190;
  uint64_t local_188;
  TermList local_180;
  TermList local_178 [2];
  Term *local_168;
  bool local_159;
  TermList *local_158;
  Term *local_148;
  TermList *local_140;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_DL & 1;
  bVar2 = Term::isSpecial((Term *)0x2b6adf);
  if (bVar2) {
    Term::getSpecialData(in_RDI);
    SVar3 = Term::specialFunctor((Term *)0x2b6b0a);
    pTVar11 = (Term *)(*(code *)(&DAT_00ed2164 + *(int *)(&DAT_00ed2164 + (ulong)SVar3 * 4)))();
    return pTVar11;
  }
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_fffffffffffffb80._content);
  Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffb80._content);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffb80._content);
  Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_stack_fffffffffffffb80._content);
  Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
            ((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x2b70ff);
  Lib::Stack<bool>::push
            ((Stack<bool> *)in_stack_fffffffffffffb80._content,
             SUB81((ulong)in_stack_fffffffffffffb78 >> 0x38,0));
  Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)0x2b7127);
  Term::args(in_RDI);
  Lib::Stack<Kernel::TermList_*>::push
            ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb80._content,
             (TermList *)in_stack_fffffffffffffb78);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            this = Lib::
                   Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   ::operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                 *)0x2b716e);
            local_140 = Lib::Stack<Kernel::TermList_*>::pop(this);
            bVar2 = TermList::isEmpty((TermList *)0x2b71ac);
            if (!bVar2) break;
            pSVar5 = Lib::
                     Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     ::operator->((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)0x2b71d2);
            bVar2 = Lib::Stack<Kernel::Term_*>::isEmpty(pSVar5);
            if (bVar2) {
              pSVar10 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        ::operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                      *)0x2b7b0b);
              bVar2 = Lib::Stack<bool>::pop(pSVar10);
              local_1b8 = in_RDI;
              if (bVar2) {
                pSVar6 = Lib::
                         Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                       *)0x2b7b4e);
                in_stack_fffffffffffffbc0 =
                     (Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)Lib::Stack<Kernel::TermList>::top(pSVar6);
                Term::arity(in_RDI);
                bVar2 = Term::isLiteral((Term *)0x2b7ba0);
                if (bVar2) {
                  local_1b8 = &Literal::create((Literal *)in_stack_fffffffffffffbf8,
                                               (TermList *)in_stack_fffffffffffffbf0)->super_Term;
                }
                else {
                  bVar2 = Term::isSort((Term *)0x2b7bfb);
                  if (bVar2) {
                    local_1b8 = &AtomicSort::create((AtomicSort *)in_stack_fffffffffffffb80._content
                                                    ,(TermList *)in_stack_fffffffffffffb78)->
                                 super_Term;
                  }
                  else {
                    in_stack_fffffffffffffb9c = in_stack_fffffffffffffb9c & 0xffffff;
                    if ((bVar1 & 1) == 0) {
                      in_stack_fffffffffffffb98 = Term::arity(in_RDI);
                      bVar2 = canBeShared((TermList *)
                                          CONCAT17(in_stack_fffffffffffffb8f,
                                                   in_stack_fffffffffffffb88),
                                          in_stack_fffffffffffffb80._content);
                      in_stack_fffffffffffffb9c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffb9c);
                    }
                    if ((char)(in_stack_fffffffffffffb9c >> 0x18) == '\0') {
                      local_1b8 = Term::createNonShared
                                            (in_stack_fffffffffffffba0,
                                             (TermList *)
                                             CONCAT44(in_stack_fffffffffffffb9c,
                                                      in_stack_fffffffffffffb98));
                    }
                    else {
                      local_1b8 = Term::create((Term *)in_stack_fffffffffffffb80._content,
                                               (TermList *)in_stack_fffffffffffffb78);
                    }
                  }
                }
              }
              Lib::
              Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              ~Recycled(in_stack_fffffffffffffbc0);
              Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              ~Recycled((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                        in_stack_fffffffffffffbc0);
              Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffbc0);
              Lib::
              Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)in_stack_fffffffffffffbc0);
              return local_1b8;
            }
            pSVar5 = Lib::
                     Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     ::operator->((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                   *)0x2b7282);
            local_148 = Lib::Stack<Kernel::Term_*>::pop(pSVar5);
            pSVar10 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                      operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                  *)0x2b72c0);
            bVar2 = Lib::Stack<bool>::pop(pSVar10);
            if (bVar2) {
              pSVar6 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x2b73c6);
              pTVar9 = Lib::Stack<Kernel::TermList>::top(pSVar6);
              uVar4 = Term::arity(local_148);
              local_158 = pTVar9 + -(ulong)(uVar4 - 1);
              local_2dd = false;
              if ((bVar1 & 1) == 0) {
                Term::arity(local_148);
                local_2dd = canBeShared((TermList *)
                                        CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88
                                                ),in_stack_fffffffffffffb80._content);
              }
              local_159 = local_2dd;
              if (local_2dd == false) {
                local_168 = Term::createNonShared
                                      (in_stack_fffffffffffffba0,
                                       (TermList *)
                                       CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)
                                      );
              }
              else {
                bVar2 = Term::isSort((Term *)0x2b74bc);
                if (bVar2) {
                  local_168 = &AtomicSort::create((AtomicSort *)in_stack_fffffffffffffb80._content,
                                                  (TermList *)in_stack_fffffffffffffb78)->super_Term
                  ;
                }
                else {
                  local_168 = Term::create((Term *)in_stack_fffffffffffffb80._content,
                                           (TermList *)in_stack_fffffffffffffb78);
                }
              }
              pSVar6 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x2b7570);
              pSVar7 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x2b7587);
              sVar8 = Lib::Stack<Kernel::TermList>::length(pSVar7);
              uVar4 = Term::arity(local_148);
              Lib::Stack<Kernel::TermList>::truncate(pSVar6,(char *)(sVar8 - uVar4),__length_00);
              Lib::
              Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x2b75ee);
              TermList::TermList((TermList *)in_stack_fffffffffffffb80._content,
                                 in_stack_fffffffffffffb78);
              Lib::Stack<Kernel::TermList>::push
                        ((Stack<Kernel::TermList> *)in_stack_fffffffffffffb78,
                         in_stack_fffffffffffffb80);
              pSVar10 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        ::operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                      *)0x2b7633);
              Lib::Stack<bool>::setTop(pSVar10,true);
            }
            else {
              pSVar6 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x2b72fe);
              pSVar7 = Lib::
                       Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       ::operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                     *)0x2b7315);
              sVar8 = Lib::Stack<Kernel::TermList>::length(pSVar7);
              uVar4 = Term::arity(local_148);
              Lib::Stack<Kernel::TermList>::truncate(pSVar6,(char *)(sVar8 - uVar4),__length);
              Lib::
              Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x2b737c);
              TermList::TermList((TermList *)in_stack_fffffffffffffb80._content,
                                 in_stack_fffffffffffffb78);
              Lib::Stack<Kernel::TermList>::push
                        ((Stack<Kernel::TermList> *)in_stack_fffffffffffffb78,
                         in_stack_fffffffffffffb80);
            }
          }
          Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x2b7663);
          TermList::next(local_140);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb80._content,
                     (TermList *)in_stack_fffffffffffffb78);
          local_178[0]._content = local_140->_content;
          bVar2 = TermList::isOrdinaryVar((TermList *)0x2b76bb);
          if (!bVar2) break;
          TermList::var(local_178);
          local_180 = Kernel::Substitution::apply
                                ((Substitution *)
                                 CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
                                 (uint)(in_stack_fffffffffffffb80._content >> 0x20));
          Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
          operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)0x2b7735);
          local_188 = local_180._content;
          Lib::Stack<Kernel::TermList>::push
                    ((Stack<Kernel::TermList> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb80)
          ;
          bVar2 = TermList::operator!=(&local_180,local_178);
          if (bVar2) {
            pSVar10 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                      operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                  *)0x2b779e);
            Lib::Stack<bool>::setTop(pSVar10,true);
          }
        }
        bVar2 = TermList::isSpecialVar((TermList *)0x2b77d0);
        if (!bVar2) break;
        TermList::var(local_178);
        local_190 = SubstHelper_Aux::SpecVarHandler<false>::apply<Kernel::Substitution>
                              ((Substitution *)in_stack_fffffffffffffb78,0);
        Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x2b784a);
        Lib::Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb80);
        bVar2 = TermList::operator!=(&local_190,local_178);
        if (bVar2) {
          pSVar10 = Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                    operator->((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                *)0x2b78b3);
          Lib::Stack<bool>::setTop(pSVar10,true);
        }
      }
      bVar2 = TermList::isVar((TermList *)in_stack_fffffffffffffb80._content);
      if (!bVar2) break;
LAB_002b796f:
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x2b797c);
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb80);
    }
    TermList::term((TermList *)0x2b7908);
    bVar2 = Term::shared((Term *)0x2b791f);
    if (bVar2) {
      TermList::term((TermList *)0x2b7942);
      bVar2 = Term::ground((Term *)0x2b7959);
      if (bVar2) goto LAB_002b796f;
    }
    pTVar11 = TermList::term((TermList *)0x2b79bf);
    bVar2 = Term::isSpecial((Term *)0x2b79e6);
    if (bVar2) {
      Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x2b7a09);
      applyImpl<false,Kernel::Substitution>
                (in_RSI,(Substitution *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                 SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
      TermList::TermList((TermList *)in_stack_fffffffffffffb80._content,in_stack_fffffffffffffb78);
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb80);
    }
    else {
      in_stack_fffffffffffffbf8 =
           Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
           operator->((Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x2b7a7d);
      Lib::Stack<Kernel::Term_*>::push
                ((Stack<Kernel::Term_*> *)in_stack_fffffffffffffb80._content,
                 in_stack_fffffffffffffb78);
      in_stack_fffffffffffffbf0 =
           Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::operator->
                     ((Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                      0x2b7aab);
      Lib::Stack<bool>::push
                ((Stack<bool> *)in_stack_fffffffffffffb80._content,
                 SUB81((ulong)in_stack_fffffffffffffb78 >> 0x38,0));
      Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x2b7acd);
      Term::args(pTVar11);
      Lib::Stack<Kernel::TermList_*>::push
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb80._content,
                 (TermList *)in_stack_fffffffffffffb78);
    }
  } while( true );
}

Assistant:

Term* SubstHelper::applyImpl(Term* trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm->isSpecial()) {
    Term::SpecialTermData* sd = trm->getSpecialData();
    switch(trm->specialFunctor()) {
    case SpecialFunctor::ITE:
      return Term::createITE(
    applyImpl<ProcessSpecVars>(sd->getCondition(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(1), applicator, noSharing),
    applyImpl<ProcessSpecVars>(sd->getSort(), applicator, noSharing)
    );
    case SpecialFunctor::LET:
      return Term::createLet(
    sd->getFunctor(),
    sd->getVariables(),
    applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    sd->getSort()
    );
    case SpecialFunctor::FORMULA:
      return Term::createFormula(
      applyImpl<ProcessSpecVars>(sd->getFormula(), applicator, noSharing)
      );
    case SpecialFunctor::LET_TUPLE:
      return Term::createTupleLet(
        sd->getFunctor(),
        sd->getTupleSymbols(),
        applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
        applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
        sd->getSort()
        );
    case SpecialFunctor::TUPLE:
      return Term::createTuple(applyImpl<ProcessSpecVars>(sd->getTupleTerm(), applicator, noSharing));
    case SpecialFunctor::LAMBDA:
      // TODO in principle this should not be so difficult to handle
      ASSERTION_VIOLATION;
    case SpecialFunctor::MATCH: {
      DArray<TermList> terms(trm->arity());
      for (unsigned i = 0; i < trm->arity(); i++) {
        terms[i] = applyImpl<ProcessSpecVars>(*trm->nthArgument(i), applicator, noSharing);
      }
      return Term::createMatch(sd->getSort(), sd->getMatchedSort(), trm->arity(), terms.begin());
    }
    }
    ASSERTION_VIOLATION;
  }

  Recycled<Stack<TermList*>> toDo;
  Recycled<Stack<Term*>> terms;
  Recycled<Stack<bool>> modified;
  Recycled<Stack<TermList>> args;

  modified->push(false);
  toDo->push(trm->args());

  for(;;) {
    TermList* tt=toDo->pop();
    if(tt->isEmpty()) {
      if(terms->isEmpty()) {
        //we're done, args stack contains modified arguments
        //of the topleve term/literal.
        ASS(toDo->isEmpty());
        break;
      }
      Term* orig=terms->pop();
      if(!modified->pop()) {
        args->truncate(args->length() - orig->arity());
        args->push(TermList(orig));
        continue;
      }
      //here we assume, that stack is an array with
      //second topmost element as &top()-1, third at
      //&top()-2, etc...
      TermList* argLst=&args->top() - (orig->arity()-1);

      bool shouldShare=!noSharing && canBeShared(argLst, orig->arity());

      Term* newTrm;
      if(shouldShare) {
        if(orig->isSort()){
          newTrm=AtomicSort::create(static_cast<AtomicSort*>(orig), argLst);
        } else {
          newTrm=Term::create(orig,argLst);
        }
      }
      else {
        newTrm=Term::createNonShared(orig,argLst);
      }
      args->truncate(args->length() - orig->arity());
      args->push(TermList(newTrm));

      modified->setTop(true);
      continue;
    }
    toDo->push(tt->next());

    TermList tl=*tt;
    if(tl.isOrdinaryVar()) {
      TermList tDest=applicator.apply(tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    if(tl.isSpecialVar()) {
      TermList tDest=SpecVarHandler<ProcessSpecVars>::apply(applicator,tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    ASS(tl.isTerm());
    if(tl.isVar() || (tl.term()->shared() && tl.term()->ground())) {
      args->push(tl);
      continue;
    }
    Term* t = tl.term();
    if(t->isSpecial()) {
      //we handle specal terms at the top level of this function
      args->push(TermList(applyImpl<ProcessSpecVars>(t, applicator, noSharing)));
      continue;
    }
    terms->push(t);
    modified->push(false);
    toDo->push(t->args());
  }
  ASS(toDo->isEmpty());
  ASS(terms->isEmpty());
  ASS_EQ(modified->length(),1);
  ASS_EQ(args->length(),trm->arity());

  Term* result;
  if(!modified->pop()) {
    result=trm;
  }
  else {
    //here we assume, that stack is an array with
    //second topmost element as &top()-1, third at
    //&top()-2, etc...
    TermList* argLst=&args->top() - (trm->arity()-1);
    ASS_EQ(args->size(), trm->arity());
    if(trm->isLiteral()) {
      ASS(!noSharing);
      Literal* lit = static_cast<Literal*>(trm);
      result=Literal::create(lit,argLst);
    } else if(trm->isSort()){
      ASS(!noSharing);
      result=AtomicSort::create(static_cast<AtomicSort*>(trm),argLst);
    } else {
      bool shouldShare=!noSharing && canBeShared(argLst, trm->arity());
      if(shouldShare) {
        result=Term::create(trm,argLst);          
      } else {
        //At the memoent all sorts should be shared.
        result=Term::createNonShared(trm,argLst);
      }
    }
  }

  return result;
}